

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O2

DdNode * Cudd_addMaximum(DdManager *dd,DdNode **f,DdNode **g)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  
  pDVar2 = *f;
  pDVar1 = *g;
  pDVar3 = pDVar2;
  if (((pDVar2 != pDVar1) && (pDVar3 = pDVar1, pDVar2 != dd->minusinfinity)) &&
     (pDVar3 = pDVar2, pDVar1 != dd->minusinfinity)) {
    if ((pDVar2->index == 0x7fffffff) && (pDVar1->index == 0x7fffffff)) {
      if ((pDVar2->type).value < (pDVar1->type).value) {
        pDVar2 = pDVar1;
      }
      return pDVar2;
    }
    if (pDVar1 < pDVar2) {
      *f = pDVar1;
      *g = pDVar2;
    }
    return (DdNode *)0x0;
  }
  return pDVar3;
}

Assistant:

DdNode *
Cudd_addMaximum(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *F, *G;

    F = *f; G = *g;
    if (F == G) return(F);
    if (F == DD_MINUS_INFINITY(dd)) return(G);
    if (G == DD_MINUS_INFINITY(dd)) return(F);
#if 0
    /* These special cases probably do not pay off. */
    if (F == DD_PLUS_INFINITY(dd)) return(F);
    if (G == DD_PLUS_INFINITY(dd)) return(G);
#endif
    if (cuddIsConstant(F) && cuddIsConstant(G)) {
        if (cuddV(F) >= cuddV(G)) {
            return(F);
        } else {
            return(G);
        }
    }
    if (F > G) { /* swap f and g */
        *f = G;
        *g = F;
    }
    return(NULL);

}